

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

void drwav_u8_to_s16(drwav_int16 *pOut,drwav_uint8 *pIn,size_t sampleCount)

{
  size_t i;
  
  for (i = 0; sampleCount != i; i = i + 1) {
    pOut[i] = (ushort)pIn[i] << 8 ^ 0x8000;
  }
  return;
}

Assistant:

void drwav_u8_to_s16(drwav_int16* pOut, const drwav_uint8* pIn, size_t sampleCount)
{
    int r;
    for (size_t i = 0; i < sampleCount; ++i) {
        int x = pIn[i];
        r = x - 128;
        r = r << 8;
        pOut[i] = (short)r;
    }
}